

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::(anonymous_namespace)::passthrough_clipper<float>::
line_to<agge::rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,agge::tests::(anonymous_namespace)::scaling_r<3,1>>>
          (passthrough_clipper<float> *this,
          rasterizer<agge::tests::(anonymous_namespace)::passthrough_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<3,_1>_>
          *sink,float x,float y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = -(uint)(0.0 < *(float *)this * 256.0);
  uVar2 = -(uint)(0.0 < *(float *)(this + 4) * 256.0);
  uVar3 = -(uint)(0.0 < x * 256.0);
  uVar4 = -(uint)(0.0 < y * 256.0);
  vector_rasterizer::line
            (&sink->super_vector_rasterizer,
             (int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + *(float *)this * 256.0),
             (int)((float)(~uVar2 & 0xbf000000 | uVar2 & 0x3f000000) + *(float *)(this + 4) * 256.0)
             ,(int)((float)(~uVar3 & 0xbf000000 | uVar3 & 0x3f000000) + x * 256.0),
             (int)((float)(~uVar4 & 0xbf000000 | uVar4 & 0x3f000000) + y * 256.0));
  *(float *)this = x;
  *(float *)(this + 4) = y;
  return;
}

Assistant:

void line_to(LinesSinkT &sink, T x, T y)
				{
					sink.line(_last_x, _last_y, x, y);
					move_to(x, y);
				}